

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,GlobalFederateId federateID)

{
  int iVar1;
  FedInfo **ppFVar2;
  int iVar3;
  long lVar4;
  FedInfo **ppFVar5;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  GlobalFederateId local_24;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_20;
  
  local_24.gid = federateID.gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_20,&this->loopFederates,&local_24);
  iVar1 = (this->loopFederates).dataStorage.bsize;
  ppFVar2 = (this->loopFederates).dataStorage.dataptr;
  lVar4 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar5 = (FedInfo **)
              &gmlc::containers::
               StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
               emptyValue;
  }
  else {
    ppFVar5 = ppFVar2 + lVar4 + 1;
  }
  iVar3 = 0;
  if (iVar1 != 0x20) {
    iVar3 = iVar1;
    ppFVar5 = ppFVar2 + lVar4;
  }
  if (ppFVar5 == local_20.vec) {
    if (iVar3 != local_20.offset) goto LAB_002f213f;
  }
  else if (((local_20.vec == (FedInfo **)0x0) || (*local_20.vec != (FedInfo *)0x0)) ||
          (iVar3 != local_20.offset || *ppFVar5 != (FedInfo *)0x0)) {
LAB_002f213f:
    return (local_20.ptr)->fed;
  }
  return (FederateState *)0x0;
}

Assistant:

FederateState* CommonCore::getFederateCore(GlobalFederateId federateID)
{
    auto fed = loopFederates.find(federateID);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}